

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O3

void __thiscall QPDFNameTreeObjectHelper::iterator::updateIValue(iterator *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  pointer pTVar3;
  element_type p;
  string local_98;
  NNTreeIterator local_78;
  
  bVar2 = NNTreeIterator::valid
                    ((this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (bVar2) {
    peVar1 = (this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002eb0e8;
    local_78.impl = peVar1->impl;
    std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
    list(&local_78.path,&peVar1->path);
    local_78.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (peVar1->node).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (peVar1->node).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_78.node.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.node.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (local_78.node.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.node.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (local_78.node.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
      }
    }
    local_78.item_number = peVar1->item_number;
    std::pair<QPDFObjectHandle,_QPDFObjectHandle>::pair(&local_78.ivalue,&peVar1->ivalue);
    pTVar3 = NNTreeIterator::operator->(&local_78);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_98,&pTVar3->first);
    std::__cxx11::string::operator=((string *)&this->ivalue,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pTVar3 = NNTreeIterator::operator->(&local_78);
    (this->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pTVar3->second).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->ivalue).second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pTVar3->second).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    NNTreeIterator::~NNTreeIterator(&local_78);
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->ivalue,0,(char *)(this->ivalue).first._M_string_length,0x27bd96);
    this_00 = (this->ivalue).second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void
QPDFNameTreeObjectHelper::iterator::updateIValue()
{
    if (impl->valid()) {
        auto p = *impl;
        this->ivalue.first = p->first.getUTF8Value();
        this->ivalue.second = p->second;
    } else {
        this->ivalue.first = "";
        this->ivalue.second = QPDFObjectHandle();
    }
}